

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayGetterCalls.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArrayGetterCalls::initTest(TextureCubeMapArrayGetterCalls *this)

{
  NotSupportedError *this_00;
  mapped_type_conflict *pmVar1;
  value_type_conflict4 local_f4 [17];
  key_type local_b0 [26];
  undefined1 local_45;
  allocator<char> local_31;
  string local_30;
  TextureCubeMapArrayGetterCalls *local_10;
  TextureCubeMapArrayGetterCalls *this_local;
  
  local_10 = this;
  if (((this->super_TestCaseBase).m_is_texture_cube_map_array_supported & 1U) == 0) {
    local_45 = 1;
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Texture cube map array functionality not supported, skipping",
               &local_31);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_30);
    local_45 = 0;
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  local_b0[0x19] = 0x813c;
  pmVar1 = std::
           map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
           ::operator[](&this->pnames_for_gettexparameter_default,local_b0 + 0x19);
  *pmVar1 = 0;
  local_b0[0x18] = 0x813d;
  pmVar1 = std::
           map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
           ::operator[](&this->pnames_for_gettexparameter_default,local_b0 + 0x18);
  *pmVar1 = 1000;
  local_b0[0x17] = 0x2801;
  pmVar1 = std::
           map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
           ::operator[](&this->pnames_for_gettexparameter_default,local_b0 + 0x17);
  *pmVar1 = 0x2702;
  local_b0[0x16] = 0x2800;
  pmVar1 = std::
           map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
           ::operator[](&this->pnames_for_gettexparameter_default,local_b0 + 0x16);
  *pmVar1 = 0x2601;
  local_b0[0x15] = 0x813a;
  pmVar1 = std::
           map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
           ::operator[](&this->pnames_for_gettexparameter_default,local_b0 + 0x15);
  *pmVar1 = -1000;
  local_b0[0x14] = 0x813b;
  pmVar1 = std::
           map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
           ::operator[](&this->pnames_for_gettexparameter_default,local_b0 + 0x14);
  *pmVar1 = 1000;
  local_b0[0x13] = 0x8e42;
  pmVar1 = std::
           map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
           ::operator[](&this->pnames_for_gettexparameter_default,local_b0 + 0x13);
  *pmVar1 = 0x1903;
  local_b0[0x12] = 0x8e43;
  pmVar1 = std::
           map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
           ::operator[](&this->pnames_for_gettexparameter_default,local_b0 + 0x12);
  *pmVar1 = 0x1904;
  local_b0[0x11] = 0x8e44;
  pmVar1 = std::
           map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
           ::operator[](&this->pnames_for_gettexparameter_default,local_b0 + 0x11);
  *pmVar1 = 0x1905;
  local_b0[0x10] = 0x8e45;
  pmVar1 = std::
           map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
           ::operator[](&this->pnames_for_gettexparameter_default,local_b0 + 0x10);
  *pmVar1 = 0x1906;
  local_b0[0xf] = 0x2802;
  pmVar1 = std::
           map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
           ::operator[](&this->pnames_for_gettexparameter_default,local_b0 + 0xf);
  *pmVar1 = 0x2901;
  local_b0[0xe] = 0x2803;
  pmVar1 = std::
           map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
           ::operator[](&this->pnames_for_gettexparameter_default,local_b0 + 0xe);
  *pmVar1 = 0x2901;
  local_b0[0xd] = 0x8072;
  pmVar1 = std::
           map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
           ::operator[](&this->pnames_for_gettexparameter_default,local_b0 + 0xd);
  *pmVar1 = 0x2901;
  local_b0[0xc] = 0x813c;
  pmVar1 = std::
           map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
           ::operator[](&this->pnames_for_gettexparameter_modified,local_b0 + 0xc);
  *pmVar1 = 1;
  local_b0[0xb] = 0x813d;
  pmVar1 = std::
           map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
           ::operator[](&this->pnames_for_gettexparameter_modified,local_b0 + 0xb);
  *pmVar1 = 1;
  local_b0[10] = 0x2801;
  pmVar1 = std::
           map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
           ::operator[](&this->pnames_for_gettexparameter_modified,local_b0 + 10);
  *pmVar1 = 0x2600;
  local_b0[9] = 0x2800;
  pmVar1 = std::
           map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
           ::operator[](&this->pnames_for_gettexparameter_modified,local_b0 + 9);
  *pmVar1 = 0x2600;
  local_b0[8] = 0x813a;
  pmVar1 = std::
           map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
           ::operator[](&this->pnames_for_gettexparameter_modified,local_b0 + 8);
  *pmVar1 = -10;
  local_b0[7] = 0x813b;
  pmVar1 = std::
           map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
           ::operator[](&this->pnames_for_gettexparameter_modified,local_b0 + 7);
  *pmVar1 = 10;
  local_b0[6] = 0x8e42;
  pmVar1 = std::
           map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
           ::operator[](&this->pnames_for_gettexparameter_modified,local_b0 + 6);
  *pmVar1 = 0x1904;
  local_b0[5] = 0x8e43;
  pmVar1 = std::
           map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
           ::operator[](&this->pnames_for_gettexparameter_modified,local_b0 + 5);
  *pmVar1 = 0x1905;
  local_b0[4] = 0x8e44;
  pmVar1 = std::
           map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
           ::operator[](&this->pnames_for_gettexparameter_modified,local_b0 + 4);
  *pmVar1 = 0x1906;
  local_b0[3] = 0x8e45;
  pmVar1 = std::
           map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
           ::operator[](&this->pnames_for_gettexparameter_modified,local_b0 + 3);
  *pmVar1 = 0x1903;
  local_b0[2] = 0x2802;
  pmVar1 = std::
           map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
           ::operator[](&this->pnames_for_gettexparameter_modified,local_b0 + 2);
  *pmVar1 = 0x812f;
  local_b0[1] = 0x2803;
  pmVar1 = std::
           map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
           ::operator[](&this->pnames_for_gettexparameter_modified,local_b0 + 1);
  *pmVar1 = 0x8370;
  local_b0[0] = 0x8072;
  pmVar1 = std::
           map<unsigned_int,_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
           ::operator[](&this->pnames_for_gettexparameter_modified,local_b0);
  *pmVar1 = 0x812f;
  local_f4[0x10] = 0x86a1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->pnames_for_gettexlevelparameter,local_f4 + 0x10);
  local_f4[0xf] = 0x805f;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->pnames_for_gettexlevelparameter,local_f4 + 0xf);
  local_f4[0xe] = 0x805e;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->pnames_for_gettexlevelparameter,local_f4 + 0xe);
  local_f4[0xd] = 0x805d;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->pnames_for_gettexlevelparameter,local_f4 + 0xd);
  local_f4[0xc] = 0x805c;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->pnames_for_gettexlevelparameter,local_f4 + 0xc);
  local_f4[0xb] = 0x884a;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->pnames_for_gettexlevelparameter,local_f4 + 0xb);
  local_f4[10] = 0x8c3f;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->pnames_for_gettexlevelparameter,local_f4 + 10);
  local_f4[9] = 0x88f1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->pnames_for_gettexlevelparameter,local_f4 + 9);
  local_f4[8] = 0x8c13;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->pnames_for_gettexlevelparameter,local_f4 + 8);
  local_f4[7] = 0x8c12;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->pnames_for_gettexlevelparameter,local_f4 + 7);
  local_f4[6] = 0x8c11;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->pnames_for_gettexlevelparameter,local_f4 + 6);
  local_f4[5] = 0x8c10;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->pnames_for_gettexlevelparameter,local_f4 + 5);
  local_f4[4] = 0x8c16;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->pnames_for_gettexlevelparameter,local_f4 + 4);
  local_f4[3] = 0x1003;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->pnames_for_gettexlevelparameter,local_f4 + 3);
  local_f4[2] = 0x1000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->pnames_for_gettexlevelparameter,local_f4 + 2);
  local_f4[1] = 0x1001;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->pnames_for_gettexlevelparameter,local_f4 + 1);
  local_f4[0] = 0x8071;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->pnames_for_gettexlevelparameter,local_f4);
  return;
}

Assistant:

void TextureCubeMapArrayGetterCalls::initTest(void)
{
	/* Only execute if GL_EXT_texture_cube_map_array extension is supported */
	if (!m_is_texture_cube_map_array_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_CUBE_MAP_ARRAY_EXTENSION_NOT_SUPPORTED);
	}

	pnames_for_gettexparameter_default[GL_TEXTURE_BASE_LEVEL] = 0;
	pnames_for_gettexparameter_default[GL_TEXTURE_MAX_LEVEL]  = 1000;
	pnames_for_gettexparameter_default[GL_TEXTURE_MIN_FILTER] = GL_NEAREST_MIPMAP_LINEAR;
	pnames_for_gettexparameter_default[GL_TEXTURE_MAG_FILTER] = GL_LINEAR;
	pnames_for_gettexparameter_default[GL_TEXTURE_MIN_LOD]	= -1000;
	pnames_for_gettexparameter_default[GL_TEXTURE_MAX_LOD]	= 1000;
	pnames_for_gettexparameter_default[GL_TEXTURE_SWIZZLE_R]  = GL_RED;
	pnames_for_gettexparameter_default[GL_TEXTURE_SWIZZLE_G]  = GL_GREEN;
	pnames_for_gettexparameter_default[GL_TEXTURE_SWIZZLE_B]  = GL_BLUE;
	pnames_for_gettexparameter_default[GL_TEXTURE_SWIZZLE_A]  = GL_ALPHA;
	pnames_for_gettexparameter_default[GL_TEXTURE_WRAP_S]	 = GL_REPEAT;
	pnames_for_gettexparameter_default[GL_TEXTURE_WRAP_T]	 = GL_REPEAT;
	pnames_for_gettexparameter_default[GL_TEXTURE_WRAP_R]	 = GL_REPEAT;

	pnames_for_gettexparameter_modified[GL_TEXTURE_BASE_LEVEL] = 1;
	pnames_for_gettexparameter_modified[GL_TEXTURE_MAX_LEVEL]  = 1;
	pnames_for_gettexparameter_modified[GL_TEXTURE_MIN_FILTER] = GL_NEAREST;
	pnames_for_gettexparameter_modified[GL_TEXTURE_MAG_FILTER] = GL_NEAREST;
	pnames_for_gettexparameter_modified[GL_TEXTURE_MIN_LOD]	= -10;
	pnames_for_gettexparameter_modified[GL_TEXTURE_MAX_LOD]	= 10;
	pnames_for_gettexparameter_modified[GL_TEXTURE_SWIZZLE_R]  = GL_GREEN;
	pnames_for_gettexparameter_modified[GL_TEXTURE_SWIZZLE_G]  = GL_BLUE;
	pnames_for_gettexparameter_modified[GL_TEXTURE_SWIZZLE_B]  = GL_ALPHA;
	pnames_for_gettexparameter_modified[GL_TEXTURE_SWIZZLE_A]  = GL_RED;
	pnames_for_gettexparameter_modified[GL_TEXTURE_WRAP_S]	 = GL_CLAMP_TO_EDGE;
	pnames_for_gettexparameter_modified[GL_TEXTURE_WRAP_T]	 = GL_MIRRORED_REPEAT;
	pnames_for_gettexparameter_modified[GL_TEXTURE_WRAP_R]	 = GL_CLAMP_TO_EDGE;

	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_COMPRESSED);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_ALPHA_SIZE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_BLUE_SIZE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_GREEN_SIZE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_RED_SIZE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_DEPTH_SIZE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_SHARED_SIZE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_STENCIL_SIZE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_ALPHA_TYPE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_BLUE_TYPE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_GREEN_TYPE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_RED_TYPE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_DEPTH_TYPE);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_INTERNAL_FORMAT);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_WIDTH);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_HEIGHT);
	pnames_for_gettexlevelparameter.push_back(GL_TEXTURE_DEPTH);
}